

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O0

int device_after_raid(void)

{
  int iVar1;
  fd_set *__arr;
  uint __i;
  
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    LispReadFds.__fds_bits[(uint)__arr] = 0;
  }
  iVar1 = re_init_display(0x120000,0x200000);
  if (iVar1 == -1) {
    __arr._4_4_ = -1;
  }
  else {
    set_cursor();
    init_keyboard(1);
    int_init();
    (*(currentdsp->device).after_raid)(currentdsp);
    iVar1 = *(int *)(currentdsp->display_id + 0x10) / 0x40;
    LispReadFds.__fds_bits[iVar1] =
         1L << ((byte)((long)*(int *)(currentdsp->display_id + 0x10) % 0x40) & 0x3f) |
         LispReadFds.__fds_bits[iVar1];
    flush_display_buffer();
    int_unblock();
    *EmKbdAd568K = 0xffff;
    *EmKbdAd468K = 0xffff;
    *EmKbdAd368K = 0xffff;
    *EmKbdAd268K = 0xffff;
    *EmKbdAd168K = 0xffff;
    *EmRealUtilin68K = 0xffff;
    *EmKbdAd068K = 0xffff;
    __arr._4_4_ = 0;
  }
  return __arr._4_4_;
}

Assistant:

int device_after_raid(void) {
  extern DLword *EmMouseX68K, *EmMouseY68K, *EmKbdAd068K, *EmRealUtilin68K;
  extern DLword *EmKbdAd168K, *EmKbdAd268K, *EmKbdAd368K, *EmKbdAd468K, *EmKbdAd568K;
  FD_ZERO(&LispReadFds);
  if (re_init_display(DISPLAY_OFFSET, 65536 * 16 * 2) == -1) return (-1);
  set_cursor();
  init_keyboard(1);

#ifdef TRUECOLOR
  truecolor_after_raid();
#endif /* TRUECOLOR */

#ifdef MAIKO_ENABLE_ETHERNET
  init_ether();
#if defined(USE_DLPI)
  if (ether_fd > 0)
    if (ioctl(ether_fd, I_SETSIG, S_INPUT) != 0) {
      perror("after-uraid: I_SETSIG for ether failed:\n");
      close(ether_fd);
      ether_fd = -1;
      return (-1);
    }
#endif /* USE_DLPI */
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef XWINDOW
#ifdef I_SETSIG
  if (ioctl(ConnectionNumber(currentdsp->display_id), I_SETSIG, S_INPUT) < 0)
    perror("SETSIG on X fd failed");
#endif /* I_SETSIG */
#endif /* XWINDOW */

  int_init();


#ifdef MAIKO_ENABLE_ETHERNET
  if (ether_fd > 0) FD_SET(ether_fd, &LispReadFds);
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef XWINDOW
  (currentdsp->device.after_raid)(currentdsp);
  FD_SET(ConnectionNumber(currentdsp->display_id), &LispReadFds);
  flush_display_buffer();
#elif DOS
  (currentdsp->device.after_raid)(currentdsp);
  (currentmouse->device.after_raid)(currentmouse, currentdsp);
  (currentkbd->device.after_raid)(currentkbd);
  flush_display_buffer();
#endif /* XWINDOW | DOS */

  int_unblock();
  *EmKbdAd068K = *EmRealUtilin68K = *EmKbdAd168K = *EmKbdAd268K = *EmKbdAd368K = *EmKbdAd468K =
      *EmKbdAd568K = KB_ALLUP;
  return (0);
}